

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O1

ssize_t Executor::read(int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  char cVar2;
  Var *pVVar3;
  istream *piVar4;
  undefined4 in_register_0000003c;
  _Alloc_hider local_30;
  char local_20 [4];
  undefined4 in_stack_ffffffffffffffe4;
  
  lVar1 = *(long *)(CONCAT44(in_register_0000003c,__fd) + 0x10);
  if (*(int *)(lVar1 + 0xc) != 2) {
    reportError(in_stack_ffffffffffffffe4);
  }
  local_30._M_p = local_20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_30,*(long *)(lVar1 + 0x30),
             *(long *)(lVar1 + 0x38) + *(long *)(lVar1 + 0x30));
  pVVar3 = getVar((string *)&local_30);
  if (local_30._M_p != local_20) {
    operator_delete(local_30._M_p);
  }
  piVar4 = (istream *)(ulong)pVVar3->kind;
  switch(piVar4) {
  case (istream *)0x0:
    piVar4 = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)pVVar3);
    break;
  case (istream *)0x1:
    piVar4 = std::istream::_M_extract<float>((float *)&std::cin);
    break;
  case (istream *)0x2:
    piVar4 = std::istream::_M_extract<bool>((bool *)&std::cin);
    break;
  case (istream *)0x3:
    cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x68);
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&std::cin,(string *)&pVVar3->text,cVar2);
  }
  return (ssize_t)piVar4;
}

Assistant:

void read(treeNode* node)
    {
        auto id = node->child[0];
        if(id->kind.expKind!=ExpKind::idExp)reportError(Error::lackIdentifiter);
        auto var = getVar(id->text);
        if(var->kind==AttrKind::Text)
            getline(cin,var->text);
        else if(var->kind==AttrKind::Integer)
            cin>>var->value.integer;
        else if(var->kind==AttrKind::Boolean)
            cin>>var->value.boolean;
        else if(var->kind==AttrKind::Decmical)
            cin>>var->value.decmical;
       // cout<<2333333333;
    }